

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O3

int JetHead::File::pipe(int *__pipedes)

{
  int iVar1;
  ErrCode EVar2;
  undefined8 in_RAX;
  File *pFVar3;
  int *piVar4;
  int fds [2];
  undefined8 local_18;
  
  local_18 = in_RAX;
  iVar1 = ::pipe((int *)&local_18);
  if (iVar1 == -1) {
    piVar4 = __errno_location();
    EVar2 = getErrorCode(*piVar4);
  }
  else {
    pFVar3 = (File *)operator_new(0x40,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/File.cpp"
                                  ,0x137);
    File(pFVar3,(int)local_18);
    *(File **)__pipedes = pFVar3;
    pFVar3 = (File *)operator_new(0x40,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/File.cpp"
                                  ,0x138);
    File(pFVar3,local_18._4_4_);
    *(File **)(__pipedes + 2) = pFVar3;
    EVar2 = kNoError;
  }
  return EVar2;
}

Assistant:

JetHead::ErrCode	File::pipe( File *pipe_files[ 2 ] )
{
	int fds[ 2 ];
	int res = ::pipe( fds );

	if ( res == -1 )
		return 	getErrorCode( errno );

	pipe_files[ 0 ] = jh_new File( fds[ 0 ] );
	pipe_files[ 1 ] = jh_new File( fds[ 1 ] );

	return kNoError;
}